

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O1

void __thiscall
SplitCompilationTest_empty_list_Test<unsigned_char>::TestBody
          (SplitCompilationTest_empty_list_Test<unsigned_char> *this)

{
  pointer *__ptr_2;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  list<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  split_result;
  long *local_68;
  AssertHelper local_60 [8];
  char local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  long *local_48 [2];
  long local_38 [2];
  _List_base<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  local_28;
  
  jessilib::split<std::__cxx11::list,_const_unsigned_char_*,_const_unsigned_char_*,_unsigned_char>
            ((container_type_conflict28 *)&local_28,(uchar *)0x0,(uchar *)0x0,'\0');
  local_58[0] = local_28._M_impl._M_node.super__List_node_base._M_next ==
                (_List_node_base *)&local_28;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58[0]) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_48,local_58,"split_result.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x5d,(char *)local_48[0]);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ::_M_clear(&local_28);
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_list) {
	std::basic_string_view<TypeParam> empty;
	std::list<std::basic_string<TypeParam>> split_result = split<std::list>(empty, default_delim<TypeParam>);
	EXPECT_TRUE(split_result.empty());
}